

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O0

Face * __thiscall OpenMesh::ArrayKernel::face(ArrayKernel *this,FaceHandle _fh)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  ArrayKernel *this_local;
  FaceHandle _fh_local;
  
  this_local._4_4_ = _fh.super_BaseHandle.idx_;
  bVar1 = is_valid_handle(this,_fh);
  if (!bVar1) {
    __assert_fail("is_valid_handle(_fh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/ArrayKernel.hh"
                  ,0xb6,"Face &OpenMesh::ArrayKernel::face(FaceHandle)");
  }
  iVar2 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  pvVar3 = std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
           operator[](&this->faces_,(long)iVar2);
  return pvVar3;
}

Assistant:

Face& face(FaceHandle _fh)
  {
    assert(is_valid_handle(_fh));
    return faces_[_fh.idx()];
  }